

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

JointActionObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  bool bVar1;
  const_reference ppJVar2;
  pointer ppVar3;
  LIndex in_RSI;
  vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
  *in_RDI;
  const_iterator cit;
  map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
  *in_stack_ffffffffffffffc8;
  vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
  *__n;
  _Self local_28;
  _Self local_20;
  LIndex local_18;
  value_type local_8;
  
  local_18 = in_RSI;
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeJointActionObservationHistories
                    ((PlanningUnitMADPDiscreteParameters *)
                     ((long)&in_RDI[2].
                             super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1));
  if (bVar1) {
    __n = in_RDI + 0x1c;
    Globals::CastLIndexToIndex(local_18);
    ppJVar2 = std::
              vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
              ::at(in_RDI,(size_type)__n);
    local_8 = *ppJVar2;
  }
  else {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
         ::find(in_stack_ffffffffffffffc8,(key_type *)0x9d5dcd);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>
                             *)0x9d5e07);
      local_8 = ppVar3->second;
    }
    else {
      local_8 = (value_type)0x0;
    }
  }
  return local_8;
}

Assistant:

JointActionObservationHistoryTree* 
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree(LIndex jaohI)
    const
{
    if(_m_params.GetComputeJointActionObservationHistories())
        return(_m_jointActionObservationHistoryTreeVector.at(CastLIndexToIndex(jaohI)));
    else
    {
        // cannot use m_jointActionObservationHistoryTreeMap[jaohI],
        // it violates the const, as it creates an empty object if
        // jaohI does not exist yet
        map<LIndex,JointActionObservationHistoryTree*>::const_iterator cit
            = _m_jointActionObservationHistoryTreeMap.find(jaohI);
        if(cit!=_m_jointActionObservationHistoryTreeMap.end())
            return(cit->second);
        else
        {
            return(0);
//            throw(E("GetJointActionObservationHistoryTree:: index not found in map"));
        }
    }
}